

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExitNode.cpp
# Opt level: O1

void __thiscall ExitNode::ExitNode(ExitNode *this)

{
  _Rb_tree_header *p_Var1;
  
  Node::Node(&this->super_Node,EXIT,(Instruction *)0x0,(CallInst *)0x0);
  (this->super_Node)._vptr_Node = (_func_int **)&PTR__ExitNode_00127be8;
  p_Var1 = &(this->joinSuccessors_)._M_t._M_impl.super__Rb_tree_header;
  (this->joinSuccessors_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->joinSuccessors_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->joinSuccessors_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->joinSuccessors_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header
  ;
  (this->joinSuccessors_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  return;
}

Assistant:

ExitNode::ExitNode() : Node(NodeType::EXIT) {}